

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O2

void __thiscall xray_re::xr_ogf_v3::load_detail_patch(xr_ogf_v3 *this,xr_reader *r)

{
  size_t sVar1;
  xr_reader *r_00;
  
  load_render_visual(this,r);
  r_00 = (xr_reader *)0xf;
  sVar1 = xr_reader::find_chunk(r,0xf);
  if (sVar1 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                  ,0x3e0,"void xray_re::xr_ogf_v3::load_detail_patch(xr_reader &)");
  }
  load_dpatch((xr_ogf_v3 *)r,r_00);
  load_render_visual((xr_ogf_v3 *)r,r_00);
  sVar1 = xr_reader::find_chunk(r_00,7);
  if (sVar1 != 0) {
    load_vertices((xr_ogf_v3 *)r,r_00);
    sVar1 = xr_reader::find_chunk(r_00,8);
    if (sVar1 != 0) {
      load_indices((xr_ogf_v3 *)r,r_00);
      return;
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                  ,0x3ee,"void xray_re::xr_ogf_v3::load_cached(xr_reader &)");
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                ,0x3e9,"void xray_re::xr_ogf_v3::load_cached(xr_reader &)");
}

Assistant:

void xr_ogf_v3::load_detail_patch(xr_reader& r)
{
	load_render_visual(r);
	if (!r.find_chunk(OGF3_DPATCH))
		xr_not_expected();
	load_dpatch(r);
	r.debug_find_chunk();
}